

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linear_hash.c
# Opt level: O0

void test_linear_hash_correct_bucket_after_split(planck_unit_test_t *tc)

{
  array_list_t *paVar1;
  long lVar2;
  ion_byte_t *piVar3;
  ion_byte_t *piVar4;
  ion_byte_t *piVar5;
  linear_hash_table_t *plVar6;
  int iVar7;
  ion_byte_t *key;
  double dVar8;
  planck_unit_result_t pVar9;
  int *piVar10;
  bool bVar11;
  double adStack_a0 [3];
  linear_hash_table_t *local_88;
  int *local_80;
  linear_hash_table_t *local_78;
  int *local_70;
  ion_byte_t local_68 [16];
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  int local_48;
  int local_44;
  int i;
  int hash_idx;
  ion_byte_t *hash_key;
  int *k;
  ion_fpos_t expected_bucket_location;
  double dStack_20;
  int expected_hash_bucket;
  double split_cardinality;
  linear_hash_table_t *linear_hash;
  planck_unit_test_t *tc_local;
  
  adStack_a0[2] = 5.22275312021844e-318;
  linear_hash = (linear_hash_table_t *)tc;
  split_cardinality = (double)malloc(0x78);
  adStack_a0[2] = 5.22283711137823e-318;
  test_linear_hash_setup((planck_unit_test_t *)linear_hash,(linear_hash_table_t *)split_cardinality)
  ;
  dStack_20 = (double)((*(int *)((long)split_cardinality + 0x38) *
                        (*(int *)((long)split_cardinality + 0x30) + 1) *
                       *(int *)((long)split_cardinality + 0x2c)) / 100);
  expected_bucket_location._4_4_ = 0;
  adStack_a0[2] = 5.22320766061262e-318;
  k = (int *)array_list_get(0,*(array_list_t **)((long)split_cardinality + 0x58));
  hash_key = local_68;
  local_68[0] = '\x02';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  lVar2 = -((long)*(int *)((long)split_cardinality + 4) + 0xfU & 0xfffffffffffffff0);
  _i = (ion_byte_t *)((long)&local_88 + lVar2);
  piVar3 = _i + 1;
  piVar4 = _i + 2;
  piVar5 = _i + 3;
  _i[0] = '\x02';
  dVar8 = split_cardinality;
  key = _i;
  *piVar3 = '\0';
  *piVar4 = '\0';
  *piVar5 = '\0';
  *(undefined8 *)((long)adStack_a0 + lVar2 + 0x10) = 0x1021f1;
  local_44 = insert_hash_to_bucket(key,(linear_hash_table_t *)dVar8);
  dVar8 = split_cardinality;
  piVar3 = _i;
  if (local_44 < *(int *)((long)split_cardinality + 0x28)) {
    *(undefined8 *)((long)adStack_a0 + lVar2 + 0x10) = 0x10220d;
    local_44 = hash_to_bucket(piVar3,(linear_hash_table_t *)dVar8);
  }
  iVar7 = local_44;
  local_78 = linear_hash;
  local_70 = k;
  paVar1 = *(array_list_t **)((long)split_cardinality + 0x58);
  *(undefined8 *)((long)adStack_a0 + lVar2 + 0x10) = 0x102230;
  piVar10 = (int *)array_list_get(iVar7,paVar1);
  plVar6 = local_78;
  bVar11 = local_70 == piVar10;
  *(undefined8 *)((long)adStack_a0 + lVar2 + 0x10) = 0x10225e;
  pVar9 = planck_unit_assert_true
                    ((planck_unit_test_t *)plVar6,(uint)bVar11,0x182,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                     ,"condition was false, expected true");
  if (pVar9 == '\0') {
    *(undefined8 *)((long)adStack_a0 + lVar2 + 0x10) = 0x102278;
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  for (local_48 = 0; plVar6 = linear_hash, (double)local_48 < dStack_20; local_48 = local_48 + 1) {
    local_4c = 2;
    local_50 = 5;
    *(double *)((long)adStack_a0 + lVar2 + 8) = split_cardinality;
    *(undefined8 *)((long)adStack_a0 + lVar2) = 0x1022c5;
    test_linear_hash_insert
              ((planck_unit_test_t *)plVar6,&local_4c,&local_50,'\0',1,'\x01',
               *(linear_hash_table_t **)((long)adStack_a0 + lVar2 + 8));
  }
  local_54 = 2;
  local_58 = 5;
  *(double *)((long)adStack_a0 + lVar2 + 8) = split_cardinality;
  *(undefined8 *)((long)adStack_a0 + lVar2) = 0x10230a;
  test_linear_hash_insert
            ((planck_unit_test_t *)plVar6,&local_54,&local_58,'\0',1,'\x01',
             *(linear_hash_table_t **)((long)adStack_a0 + lVar2 + 8));
  expected_bucket_location._4_4_ = 0;
  paVar1 = *(array_list_t **)((long)split_cardinality + 0x58);
  *(undefined8 *)((long)adStack_a0 + lVar2 + 0x10) = 0x102325;
  k = (int *)array_list_get(0,paVar1);
  dVar8 = split_cardinality;
  piVar3 = _i;
  *(undefined8 *)((long)adStack_a0 + lVar2 + 0x10) = 0x102336;
  local_44 = insert_hash_to_bucket(piVar3,(linear_hash_table_t *)dVar8);
  dVar8 = split_cardinality;
  piVar3 = _i;
  if (local_44 < *(int *)((long)split_cardinality + 0x28)) {
    *(undefined8 *)((long)adStack_a0 + lVar2 + 0x10) = 0x102352;
    local_44 = hash_to_bucket(piVar3,(linear_hash_table_t *)dVar8);
  }
  iVar7 = local_44;
  local_88 = linear_hash;
  local_80 = k;
  paVar1 = *(array_list_t **)((long)split_cardinality + 0x58);
  *(undefined8 *)((long)adStack_a0 + lVar2 + 0x10) = 0x102375;
  piVar10 = (int *)array_list_get(iVar7,paVar1);
  plVar6 = local_88;
  bVar11 = local_80 == piVar10;
  *(undefined8 *)((long)adStack_a0 + lVar2 + 0x10) = 0x1023a3;
  pVar9 = planck_unit_assert_true
                    ((planck_unit_test_t *)plVar6,(uint)bVar11,0x199,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/linear_hash/test_linear_hash.c"
                     ,"condition was false, expected true");
  plVar6 = linear_hash;
  dVar8 = split_cardinality;
  if (pVar9 == '\0') {
    *(undefined8 *)((long)adStack_a0 + lVar2 + 0x10) = 0x1023bd;
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  *(undefined8 *)((long)adStack_a0 + lVar2 + 0x10) = 0x1023ca;
  test_linear_hash_takedown((planck_unit_test_t *)plVar6,(linear_hash_table_t *)dVar8);
  return;
}

Assistant:

void
test_linear_hash_correct_bucket_after_split(
	planck_unit_test_t *tc
) {
	linear_hash_table_t *linear_hash = malloc(sizeof(linear_hash_table_t));

	test_linear_hash_setup(tc, linear_hash);

	double split_cardinality				= linear_hash->records_per_bucket * (linear_hash->num_buckets + 1) * linear_hash->split_threshold / 100;

	/* assuming initial size of 5 so that key 5 hashes to bucket 0 using h0 */
	int			expected_hash_bucket		= 0;
	ion_fpos_t	expected_bucket_location	= array_list_get(expected_hash_bucket, linear_hash->bucket_map);

	int *k									= alloca(sizeof(int));

	*k = 2;

	ion_byte_t *hash_key = alloca(linear_hash->super.record.key_size);

	memcpy(hash_key, k, sizeof(linear_hash->super.record.key_size));

	/* resolve bucket key 5 hashes to given the current linear_hash state - should be 0 */
	int hash_idx = insert_hash_to_bucket(hash_key, linear_hash);

	if (hash_idx < linear_hash->next_split) {
		hash_idx = hash_to_bucket(hash_key, linear_hash);
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, expected_bucket_location == array_list_get(hash_idx, linear_hash->bucket_map));

	int i;

	/* test while inserting to reach threshold - linear_hash.num_buckets should not change over this range */
	for (i = 0; i < split_cardinality; i++) {
		test_linear_hash_insert(tc, IONIZE(2, int), IONIZE(5, int), err_ok, 1, boolean_true, linear_hash);
	}

	/* test inserting push above threshold - linear_hash.num_buckets should increase by one */
	test_linear_hash_insert(tc, IONIZE(2, int), IONIZE(5, int), err_ok, 1, boolean_true, linear_hash);

	expected_hash_bucket		= 0;
	expected_bucket_location	= array_list_get(expected_hash_bucket, linear_hash->bucket_map);

	/* resolve key 2 hashes to given the current linear_hash state - should be 2 */
	hash_idx					= insert_hash_to_bucket(hash_key, linear_hash);

	if (hash_idx < linear_hash->next_split) {
		hash_idx = hash_to_bucket(hash_key, linear_hash);
	}

	/* assuming initial size of 2 so that key 2 hashes to bucket 2 using h1 */
	PLANCK_UNIT_ASSERT_TRUE(tc, expected_bucket_location == array_list_get(hash_idx, linear_hash->bucket_map));

	test_linear_hash_takedown(tc, linear_hash);
}